

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateRequestTimeAsync(HelicsFederate fed,HelicsTime requestTime,HelicsError *err)

{
  Federate *this;
  Time nextInternalTimeStep;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    nextInternalTimeStep.internalTimeCode = count_time<9,_long>::convert(requestTime);
    helics::Federate::requestTimeAsync(this,nextInternalTimeStep);
  }
  return;
}

Assistant:

void helicsFederateRequestTimeAsync(HelicsFederate fed, HelicsTime requestTime, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->requestTimeAsync(requestTime);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}